

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::UnixEventPort::ChildSet> * __thiscall
kj::Own<kj::UnixEventPort::ChildSet>::operator=
          (Own<kj::UnixEventPort::ChildSet> *this,Own<kj::UnixEventPort::ChildSet> *other)

{
  Disposer *this_00;
  ChildSet *object;
  ChildSet *ptrCopy;
  Disposer *disposerCopy;
  Own<kj::UnixEventPort::ChildSet> *other_local;
  Own<kj::UnixEventPort::ChildSet> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (ChildSet *)0x0;
  if (object != (ChildSet *)0x0) {
    Disposer::dispose<kj::UnixEventPort::ChildSet>(this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }